

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O1

word zzPowerModW(word a,word b,word mod,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  size_t sVar20;
  word wVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  
  if (b == 0) {
    wVar21 = 1;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = a;
    uVar17 = __umodti3(SUB168(auVar1 * auVar8,0),SUB168(auVar1 * auVar8,8),mod,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar17;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = a;
    uVar18 = __umodti3(SUB168(auVar2 * auVar9,0),SUB168(auVar2 * auVar9,8),mod,0);
    *(ulong *)((long)stack + 8) = uVar18;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar18;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar17;
    uVar18 = __umodti3(SUB168(auVar3 * auVar10,0),SUB168(auVar3 * auVar10,8),mod,0);
    *(ulong *)((long)stack + 0x10) = uVar18;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar18;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar17;
    uVar19 = __umodti3(SUB168(auVar4 * auVar11,0),SUB168(auVar4 * auVar11,8),mod,0);
    *(undefined8 *)((long)stack + 0x18) = uVar19;
    *(word *)stack = a;
    sVar20 = u64CLZ(b);
    uVar18 = 0x40 - sVar20;
    uVar17 = 3;
    if (uVar18 < 3) {
      uVar17 = uVar18;
    }
    uVar23 = (uint)(b >> ((char)uVar18 - (byte)uVar17 & 0x3f)) & ~(-1 << ((byte)uVar17 & 0x1f));
    uVar18 = (ulong)uVar23;
    uVar22 = uVar18;
    if ((uVar23 & 1) == 0) {
      do {
        uVar22 = uVar18 >> 1;
        uVar17 = uVar17 - 1;
        uVar15 = uVar18 & 2;
        uVar18 = uVar22;
      } while (uVar15 == 0);
    }
    wVar21 = *(word *)((long)stack + (uVar22 & 0xfffffffffffffffe) * 4);
    if (sVar20 + uVar17 != 0x40) {
      uVar17 = 0x3f - (sVar20 + uVar17);
      do {
        if ((b >> (uVar17 & 0x3f) & 1) == 0) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = wVar21;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = wVar21;
          wVar21 = __umodti3(SUB168(auVar5 * auVar12,0),SUB168(auVar5 * auVar12,8),mod,0);
          lVar16 = -1;
        }
        else {
          uVar18 = uVar17 + 1;
          uVar22 = 3;
          if (uVar18 < 3) {
            uVar22 = uVar18;
          }
          uVar23 = (int)uVar18 - (int)uVar22;
          uVar18 = b >> ((ulong)uVar23 & 0x3f) & 1;
          uVar15 = (ulong)((uint)(b >> ((byte)uVar23 & 0x3f)) & ~(-1 << ((byte)uVar22 & 0x1f)));
          while (uVar18 == 0) {
            uVar22 = uVar22 - 1;
            uVar18 = uVar15 & 2;
            uVar15 = uVar15 >> 1;
          }
          if (uVar22 == 0) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = wVar21;
          }
          else {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = wVar21;
            uVar18 = uVar22;
            do {
              uVar24 = auVar25._0_8_;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar24;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar24;
              auVar25 = __umodti3(SUB168(auVar6 * auVar13,0),
                                  auVar25._8_8_ * uVar24 + SUB168(auVar6 * auVar13,8),mod,0);
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
          }
          lVar16 = -uVar22;
          uVar18 = *(ulong *)((long)stack + (uVar15 & 0xfffffffffffffffe) * 4);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = auVar25._0_8_;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar18;
          wVar21 = __umodti3(SUB168(auVar7 * auVar14,0),
                             auVar25._8_8_ * uVar18 + SUB168(auVar7 * auVar14,8),mod,0);
        }
        uVar17 = uVar17 + lVar16;
      } while (uVar17 != 0xffffffffffffffff);
    }
  }
  return wVar21;
}

Assistant:

word zzPowerModW(register word a, register word b, register word mod, 
	void* stack)
{
	register dword prod;
	register word slide;
	register size_t pos;
	register size_t slide_size;
	// переменные в stack
	word* powers;	/* [4]powers */
	// pre
	ASSERT(mod != 0);
	// b == 0?
	if (b == 0)
		return 1;
	// раскладка stack
	powers = (word*)stack;
	// powers <- малые нечетные степени a
	prod = a;
	prod *= a, prod %= mod, powers[0] = (word)prod;
	prod *= a, prod %= mod, powers[1] = (word)prod;
	prod *= powers[0], prod %= mod, powers[2] = (word)prod;
	prod *= powers[0], prod %= mod, powers[3] = (word)prod;
	powers[0] = a;
	// pos <- номер старшего единичного бита b
	pos = B_PER_W - 1 - wordCLZ(b);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, 3);
	slide = b >> (pos + 1 - slide_size);
	slide &= WORD_BIT_POS(slide_size) - 1;
	for (; slide % 2 == 0; slide >>= 1, slide_size--);
	// a <- powers[slide / 2]
	a = powers[slide / 2];
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
	{
		prod = a;
		if ((b & WORD_BIT_POS(pos)) == 0)
		{
			// a <- a^2 \mod mod
			prod *= a, a = prod % mod;
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, 3);
			slide = b >> (pos + 1 - slide_size);
			slide &= WORD_BIT_POS(slide_size) - 1;
			for (; slide % 2 == 0; slide >>= 1, slide_size--);
			pos -= slide_size;
			// a <- a^2 \mod mod
			while (slide_size--)
				prod *= a, prod %= mod, a = (word)prod;
			// a <- a * powers[slide / 2] \mod mod
			prod *= powers[slide / 2];
			prod %= mod;
			a = (word)prod;
		}
	}
	// выход
	prod = 0, slide = b = mod = 0, pos = slide_size = 0;
	return a;
}